

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O2

void __thiscall
tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>::take_reference
          (make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL> *this)

{
  no_storage_array_t<boost::rational<long>_> nVar1;
  overflow_error *this_00;
  
  nVar1 = (no_storage_array_t<boost::rational<long>_>)
          ((long)this[-1].super_clockval_t.super_clock_value_array_t._fam + 1);
  this[-1].super_clockval_t.super_clock_value_array_t._fam = nVar1;
  if (nVar1 != (no_storage_array_t<boost::rational<long>_>)0xfffffffffffffffe) {
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"reference counter overflow");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

inline void take_reference(void) const
  {
    refcount_t * refcount = refcount_addr();
    *refcount += 1;
    if (*refcount == REFCOUNT_MAX) // overflow
      throw std::overflow_error("reference counter overflow");
  }